

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
jaegertracing::net::IPAddress::parse
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *__return_storage_ptr__,string *hostPort)

{
  byte bVar1;
  long *plVar2;
  istringstream local_1f8 [8];
  istringstream iss;
  string local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> portStr;
  undefined1 local_40 [4];
  int port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ip;
  size_type colonPos;
  string *hostPort_local;
  
  ip.field_2._8_8_ = std::__cxx11::string::find((char)hostPort,0x3a);
  std::__cxx11::string::substr((ulong)local_40,(ulong)hostPort);
  portStr.field_2._12_4_ = 0;
  if (ip.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)hostPort);
    std::__cxx11::istringstream::istringstream(local_1f8,local_68,_S_in);
    plVar2 = (long *)std::istream::operator>>(local_1f8,(int *)(portStr.field_2._M_local_buf + 0xc))
    ;
    bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if ((bVar1 & 1) != 0) {
      portStr.field_2._12_4_ = 0;
    }
    std::__cxx11::istringstream::~istringstream(local_1f8);
    std::__cxx11::string::~string(local_68);
  }
  std::make_pair<std::__cxx11::string_const&,int&>
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (int *)(portStr.field_2._M_local_buf + 0xc));
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::pair<std::string, int> parse(const std::string& hostPort)
    {
        const auto colonPos = hostPort.find(':');
        const auto ip = hostPort.substr(0, colonPos);
        int port = 0;
        if (colonPos != std::string::npos) {
            const auto portStr = hostPort.substr(colonPos + 1);
            std::istringstream iss(portStr);
            if (!(iss >> port)) {
                port = 0;
            }
        }
        return std::make_pair(ip, port);
    }